

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_func.c
# Opt level: O1

GCfunc * lj_func_newL_gc(lua_State *L,GCproto *pt,GCfuncL *parent)

{
  TValue *pTVar1;
  byte bVar2;
  byte bVar3;
  ushort uVar4;
  uint uVar5;
  TValue *pTVar6;
  uint32_t uVar7;
  GCfunc *pGVar8;
  GCRef *pGVar9;
  ulong uVar10;
  ulong uVar11;
  GCRef *pGVar12;
  
  uVar10 = (ulong)(L->glref).ptr32;
  if (*(uint *)(uVar10 + 0x24) <= *(uint *)(uVar10 + 0x20)) {
    lj_func_newL_gc_cold_1();
  }
  uVar7 = (parent->env).gcptr32;
  pGVar8 = (GCfunc *)lj_mem_newgco(L,(uint)pt->sizeuv * 4 + 0x14);
  *(uint8_t *)((long)pGVar8 + 5) = '\b';
  *(uint8_t *)((long)pGVar8 + 6) = '\0';
  (pGVar8->c).nupvalues = '\0';
  (pGVar8->c).pc.ptr32 = (int)pt + 0x40;
  (pGVar8->c).env.gcptr32 = uVar7;
  pt->flags = (pt->flags - ((byte)(pt->flags + 0x20 >> 3) & 0xe0)) + ' ';
  bVar2 = pt->sizeuv;
  if ((ulong)bVar2 != 0) {
    pTVar6 = L->base;
    uVar10 = 0;
    do {
      uVar4 = *(ushort *)((ulong)(pt->uv).ptr32 + uVar10 * 2);
      if ((short)uVar4 < 0) {
        pTVar1 = pTVar6 + ((ulong)uVar4 & 0xff);
        uVar5 = (L->glref).ptr32;
        uVar11 = (ulong)uVar5;
        pGVar12 = &L->openupval;
        do {
          pGVar9 = (GCRef *)(ulong)pGVar12->gcptr32;
          if ((pGVar9 == (GCRef *)0x0) || ((TValue *)(ulong)pGVar9[4].gcptr32 < pTVar1)) {
            pGVar9 = (GCRef *)lj_mem_realloc(L,(void *)0x0,0,0x18);
            *(byte *)&pGVar9[1].gcptr32 = *(byte *)(uVar11 + 0x28) & 3;
            *(undefined2 *)((long)&pGVar9[1].gcptr32 + 1) = 5;
            pGVar9[4] = (GCRef)(MSize)pTVar1;
            pGVar9->gcptr32 = pGVar12->gcptr32;
            uVar7 = (uint32_t)pGVar9;
            pGVar12->gcptr32 = uVar7;
            pGVar9[2] = (GCRef)(uVar5 + 0xb0);
            uVar5 = *(uint *)(uVar11 + 0xbc);
            pGVar9[3] = (GCRef)uVar5;
            *(uint32_t *)((ulong)uVar5 + 8) = uVar7;
            *(uint32_t *)(uVar11 + 0xbc) = uVar7;
            goto LAB_0010ad9f;
          }
          pGVar12 = pGVar9;
        } while (pTVar1 != (TValue *)(ulong)pGVar9[4].gcptr32);
        bVar3 = (byte)pGVar9[1].gcptr32;
        if ((~*(byte *)(uVar11 + 0x28) & bVar3 & 3) != 0) {
          *(byte *)&pGVar9[1].gcptr32 = bVar3 ^ 3;
        }
LAB_0010ad9f:
        *(byte *)((long)&pGVar9[1].gcptr32 + 3) = (byte)(uVar4 >> 0xe) & 1;
        pGVar9[5] = (GCRef)((uint)uVar4 << 0x18 ^ (parent->pc).ptr32);
      }
      else {
        pGVar9 = (GCRef *)(ulong)parent->uvptr[uVar4].gcptr32;
      }
      *(int *)((long)pGVar8 + uVar10 * 4 + 0x14) = (int)pGVar9;
      uVar10 = uVar10 + 1;
    } while (uVar10 != bVar2);
  }
  (pGVar8->c).nupvalues = bVar2;
  return pGVar8;
}

Assistant:

GCfunc *lj_func_newL_gc(lua_State *L, GCproto *pt, GCfuncL *parent)
{
  GCfunc *fn;
  GCRef *puv;
  MSize i, nuv;
  TValue *base;
  lj_gc_check_fixtop(L);
  fn = func_newL(L, pt, tabref(parent->env));
  /* NOBARRIER: The GCfunc is new (marked white). */
  puv = parent->uvptr;
  nuv = pt->sizeuv;
  base = L->base;
  for (i = 0; i < nuv; i++) {
    uint32_t v = proto_uv(pt)[i];
    GCupval *uv;
    if ((v & PROTO_UV_LOCAL)) {
      uv = func_finduv(L, base + (v & 0xff));
      uv->immutable = ((v / PROTO_UV_IMMUTABLE) & 1);
      uv->dhash = (uint32_t)(uintptr_t)mref(parent->pc, char) ^ (v << 24);
    } else {
      uv = &gcref(puv[v])->uv;
    }
    setgcref(fn->l.uvptr[i], obj2gco(uv));
  }
  fn->l.nupvalues = (uint8_t)nuv;
  return fn;
}